

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O0

void __thiscall FShaderProgram::Link(FShaderProgram *this,char *name)

{
  GLuint handle;
  char *pcVar1;
  char *pcVar2;
  FShaderProgram local_38;
  GLint status;
  FString local_20;
  char *local_18;
  char *name_local;
  FShaderProgram *this_local;
  
  handle = this->mProgram;
  local_18 = name;
  name_local = (char *)this;
  FString::FString(&local_20,name);
  FGLDebug::LabelObject(0x82e2,handle,&local_20);
  FString::~FString(&local_20);
  (*_ptrc_glLinkProgram)(this->mProgram);
  local_38.mShaders[1] = 0;
  (*_ptrc_glGetProgramiv)(this->mProgram,0x8b82,(GLint *)(local_38.mShaders + 1));
  pcVar1 = local_18;
  if (local_38.mShaders[1] == 0) {
    GetProgramInfoLog(&local_38,(GLuint)this);
    pcVar2 = FString::GetChars((FString *)&local_38);
    I_FatalError("Link Shader \'%s\':\n%s\n",pcVar1,pcVar2);
    FString::~FString((FString *)&local_38);
  }
  return;
}

Assistant:

void FShaderProgram::Link(const char *name)
{
	FGLDebug::LabelObject(GL_PROGRAM, mProgram, name);
	glLinkProgram(mProgram);

	GLint status = 0;
	glGetProgramiv(mProgram, GL_LINK_STATUS, &status);
	if (status == GL_FALSE)
	{
		I_FatalError("Link Shader '%s':\n%s\n", name, GetProgramInfoLog(mProgram).GetChars());
	}
}